

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

int sat_solver_solve(sat_solver *s,lit *begin,lit *end,ABC_INT64_T nConfLimit,ABC_INT64_T nInsLimit,
                    ABC_INT64_T nConfLimitGlobal,ABC_INT64_T nInsLimitGlobal)

{
  int iVar1;
  int iVar2;
  int RetValue_1;
  int RetValue;
  lit *i;
  lbool status;
  ABC_INT64_T nConfLimitGlobal_local;
  ABC_INT64_T nInsLimit_local;
  ABC_INT64_T nConfLimit_local;
  lit *end_local;
  lit *begin_local;
  sat_solver *s_local;
  
  if (s->fSolved == 0) {
    if (s->fVerbose != 0) {
      printf("Running SAT solver with parameters %d and %d and %d.\n",(ulong)(uint)s->nLearntStart,
             (ulong)(uint)s->nLearntDelta,(ulong)(uint)s->nLearntRatio);
    }
    sat_solver_set_resource_limits(s,nConfLimit,nInsLimit,nConfLimitGlobal,nInsLimitGlobal);
    s->root_level = 0;
    for (_RetValue_1 = begin; _RetValue_1 < end; _RetValue_1 = _RetValue_1 + 1) {
      iVar1 = sat_solver_push(s,*_RetValue_1);
      if (iVar1 == 0) {
        sat_solver_canceluntil(s,0);
        s->root_level = 0;
        return -1;
      }
    }
    iVar1 = s->root_level;
    iVar2 = sat_solver_dl(s);
    if (iVar1 != iVar2) {
      __assert_fail("s->root_level == sat_solver_dl(s)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                    ,0x832,
                    "int sat_solver_solve(sat_solver *, lit *, lit *, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T)"
                   );
    }
    iVar1 = sat_solver_solve_internal(s);
    sat_solver_canceluntil(s,0);
    s->root_level = 0;
    if ((((char)iVar1 == -1) && (s->pStore != (void *)0x0)) &&
       (iVar2 = Sto_ManAddClause((Sto_Man_t *)s->pStore,(lit *)0x0,(lit *)0x0), iVar2 == 0)) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                    ,0x850,
                    "int sat_solver_solve(sat_solver *, lit *, lit *, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T)"
                   );
    }
    s_local._4_4_ = (int)(char)iVar1;
  }
  else {
    if ((s->pStore != (void *)0x0) &&
       (iVar1 = Sto_ManAddClause((Sto_Man_t *)s->pStore,(lit *)0x0,(lit *)0x0), iVar1 == 0)) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                    ,0x81c,
                    "int sat_solver_solve(sat_solver *, lit *, lit *, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T)"
                   );
    }
    s_local._4_4_ = -1;
  }
  return s_local._4_4_;
}

Assistant:

int sat_solver_solve(sat_solver* s, lit* begin, lit* end, ABC_INT64_T nConfLimit, ABC_INT64_T nInsLimit, ABC_INT64_T nConfLimitGlobal, ABC_INT64_T nInsLimitGlobal)
{
    lbool status;
    lit * i;
    ////////////////////////////////////////////////
    if ( s->fSolved )
    {
        if ( s->pStore )
        {
            int RetValue = Sto_ManAddClause( (Sto_Man_t *)s->pStore, NULL, NULL );
            assert( RetValue );
            (void) RetValue;
        }
        return l_False;
    }
    ////////////////////////////////////////////////

    if ( s->fVerbose )
        printf( "Running SAT solver with parameters %d and %d and %d.\n", s->nLearntStart, s->nLearntDelta, s->nLearntRatio );

    sat_solver_set_resource_limits( s, nConfLimit, nInsLimit, nConfLimitGlobal, nInsLimitGlobal );

#ifdef SAT_USE_ANALYZE_FINAL
    // Perform assumptions:
    s->root_level = 0;
    for ( i = begin; i < end; i++ )
        if ( !sat_solver_push(s, *i) )
        {
            sat_solver_canceluntil(s,0);
            s->root_level = 0;
            return l_False;
        }
    assert(s->root_level == sat_solver_dl(s));
#else
    //printf("solve: "); printlits(begin, end); printf("\n");
    for (i = begin; i < end; i++){
//        switch (lit_sign(*i) ? -s->assignss[lit_var(*i)] : s->assignss[lit_var(*i)]){
        switch (var_value(s, *i)) {
        case var1: // l_True: 
            break;
        case varX: // l_Undef
            sat_solver_decision(s, *i);
            if (sat_solver_propagate(s) == 0)
                break;
            // fallthrough
        case var0: // l_False 
            sat_solver_canceluntil(s, 0);
            return l_False;
        }
    }
    s->root_level = sat_solver_dl(s);
#endif

    status = sat_solver_solve_internal(s);

    sat_solver_canceluntil(s,0);
    s->root_level = 0;

    ////////////////////////////////////////////////
    if ( status == l_False && s->pStore )
    {
        int RetValue = Sto_ManAddClause( (Sto_Man_t *)s->pStore, NULL, NULL );
        assert( RetValue );
        (void) RetValue;
    }
    ////////////////////////////////////////////////
    return status;
}